

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

void __thiscall CPlayer::OnDirectInput(CPlayer *this,CNetObj_PlayerInput *NewInput)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  CCharacter *pCVar4;
  CEntity *pCVar5;
  CFlag *pCVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar11;
  undefined1 auVar10 [16];
  float fVar12;
  float fVar13;
  
  uVar3 = NewInput->m_PlayerFlags;
  if ((this->m_pGameServer->m_World).m_Paused == true) {
LAB_00122dda:
    this->m_PlayerFlags = uVar3;
    return;
  }
  if ((uVar3 & 2) != 0) {
    if ((this->m_PlayerFlags & 2) != 0) {
      return;
    }
    if (this->m_pCharacter != (CCharacter *)0x0) {
      CCharacter::ResetInput(this->m_pCharacter);
      uVar3 = NewInput->m_PlayerFlags;
    }
    goto LAB_00122dda;
  }
  this->m_PlayerFlags = uVar3;
  if (this->m_pCharacter == (CCharacter *)0x0) {
    pCVar4 = (CCharacter *)0x0;
  }
  else {
    CCharacter::OnDirectInput(this->m_pCharacter,NewInput);
    pCVar4 = this->m_pCharacter;
  }
  iVar7 = this->m_Team;
  if (iVar7 == -1 || pCVar4 != (CCharacter *)0x0) {
LAB_00122e60:
    if (((pCVar4 == (CCharacter *)0x0) && (iVar7 == -1)) && ((NewInput->m_Fire & 1) != 0)) {
      if (this->m_ActiveSpecSwitch != false) goto LAB_00122e81;
      this->m_ActiveSpecSwitch = true;
      if (this->m_SpecMode != 0) {
        this->m_SpecMode = 0;
        this->m_SpectatorID = -1;
        this->m_pSpecFlag = (CFlag *)0x0;
        goto LAB_00122e81;
      }
      pCVar5 = CGameWorld::ClosestEntity
                         (&this->m_pGameServer->m_World,this->m_ViewPos,192.0,3,(CEntity *)0x0);
      pCVar6 = (CFlag *)CGameWorld::ClosestEntity
                                  (&this->m_pGameServer->m_World,this->m_ViewPos,192.0,4,
                                   (CEntity *)0x0);
      if (pCVar5 == (CEntity *)0x0 && pCVar6 == (CFlag *)0x0) goto LAB_00122e81;
      if (pCVar5 == (CEntity *)0x0) {
LAB_00122fdf:
        this->m_SpecMode = 3 - (uint)(pCVar6->m_Team == 0);
        this->m_pSpecFlag = pCVar6;
        this->m_SpectatorID = -1;
      }
      else {
        if (pCVar6 != (CFlag *)0x0) {
          fVar1 = (this->m_ViewPos).field_0.x;
          fVar2 = (this->m_ViewPos).field_1.y;
          fVar9 = fVar1 - (pCVar6->super_CEntity).m_Pos.field_0.x;
          fVar11 = fVar1 - (pCVar5->m_Pos).field_0.x;
          fVar12 = fVar2 - (pCVar6->super_CEntity).m_Pos.field_1.y;
          fVar13 = fVar2 - (pCVar5->m_Pos).field_1.y;
          auVar10._0_4_ = fVar9 * fVar9 + fVar12 * fVar12;
          auVar10._4_4_ = fVar11 * fVar11 + fVar13 * fVar13;
          auVar10._8_4_ = (fVar1 - 0.0) * (fVar1 - 0.0) + (fVar2 - 0.0) * (fVar2 - 0.0);
          auVar10._12_4_ = (fVar1 - 0.0) * (fVar1 - 0.0) + (fVar2 - 0.0) * (fVar2 - 0.0);
          auVar10 = sqrtps(auVar10,auVar10);
          if (auVar10._0_4_ < auVar10._4_4_) goto LAB_00122fdf;
        }
        this->m_SpecMode = 1;
        this->m_pSpecFlag = (CFlag *)0x0;
        this->m_SpectatorID = *(int *)((long)pCVar5[1]._vptr_CEntity + 0x404);
      }
      goto LAB_00122e81;
    }
  }
  else if ((NewInput->m_Fire & 1) != 0) {
    Respawn(this);
    pCVar4 = this->m_pCharacter;
    iVar7 = this->m_Team;
    goto LAB_00122e60;
  }
  if (this->m_ActiveSpecSwitch == true) {
    this->m_ActiveSpecSwitch = false;
  }
LAB_00122e81:
  if (NewInput->m_Direction == 0) {
    iVar7 = (this->m_LatestActivity).m_TargetX;
    iVar8 = NewInput->m_TargetX;
    if (((iVar7 == NewInput->m_TargetX) &&
        (iVar8 = iVar7, (this->m_LatestActivity).m_TargetY == NewInput->m_TargetY)) &&
       ((NewInput->m_Jump == 0 && (((NewInput->m_Fire & 1) == 0 && (NewInput->m_Hook == 0)))))) {
      return;
    }
  }
  else {
    iVar8 = NewInput->m_TargetX;
  }
  (this->m_LatestActivity).m_TargetX = iVar8;
  (this->m_LatestActivity).m_TargetY = NewInput->m_TargetY;
  this->m_LastActionTick = this->m_pGameServer->m_pServer->m_CurrentGameTick;
  this->m_InactivityTickCounter = 0;
  return;
}

Assistant:

void CPlayer::OnDirectInput(CNetObj_PlayerInput *NewInput)
{
	if(GameServer()->m_World.m_Paused)
	{
		m_PlayerFlags = NewInput->m_PlayerFlags;
		return;
	}

	if(NewInput->m_PlayerFlags&PLAYERFLAG_CHATTING)
	{
		// skip the input if chat is active
		if(m_PlayerFlags&PLAYERFLAG_CHATTING)
			return;

		// reset input
		if(m_pCharacter)
			m_pCharacter->ResetInput();

		m_PlayerFlags = NewInput->m_PlayerFlags;
		return;
	}

	m_PlayerFlags = NewInput->m_PlayerFlags;

	if(m_pCharacter)
		m_pCharacter->OnDirectInput(NewInput);

	if(!m_pCharacter && m_Team != TEAM_SPECTATORS && (NewInput->m_Fire&1))
		Respawn();

	if(!m_pCharacter && m_Team == TEAM_SPECTATORS && (NewInput->m_Fire&1))
	{
		if(!m_ActiveSpecSwitch)
		{
			m_ActiveSpecSwitch = true;
			if(m_SpecMode == SPEC_FREEVIEW)
			{
				CCharacter *pChar = (CCharacter *)GameServer()->m_World.ClosestEntity(m_ViewPos, 6.0f*32, CGameWorld::ENTTYPE_CHARACTER, 0);
				CFlag *pFlag = (CFlag *)GameServer()->m_World.ClosestEntity(m_ViewPos, 6.0f*32, CGameWorld::ENTTYPE_FLAG, 0);
				if(pChar || pFlag)
				{
					if(!pChar || (pFlag && pChar && distance(m_ViewPos, pFlag->GetPos()) < distance(m_ViewPos, pChar->GetPos())))
					{
						m_SpecMode = pFlag->GetTeam() == TEAM_RED ? SPEC_FLAGRED : SPEC_FLAGBLUE;
						m_pSpecFlag = pFlag;
						m_SpectatorID = -1;
					}
					else
					{
						m_SpecMode = SPEC_PLAYER;
						m_pSpecFlag = 0;
						m_SpectatorID = pChar->GetPlayer()->GetCID();
					}
				}
			}
			else
			{
				m_SpecMode = SPEC_FREEVIEW;
				m_pSpecFlag = 0;
				m_SpectatorID = -1;
			}
		}
	}
	else if(m_ActiveSpecSwitch)
		m_ActiveSpecSwitch = false;

	// check for activity
	if(NewInput->m_Direction || m_LatestActivity.m_TargetX != NewInput->m_TargetX ||
		m_LatestActivity.m_TargetY != NewInput->m_TargetY || NewInput->m_Jump ||
		NewInput->m_Fire&1 || NewInput->m_Hook)
	{
		m_LatestActivity.m_TargetX = NewInput->m_TargetX;
		m_LatestActivity.m_TargetY = NewInput->m_TargetY;
		m_LastActionTick = Server()->Tick();
		m_InactivityTickCounter = 0;
	}
}